

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_calculator.cpp
# Opt level: O0

void __thiscall ON_ArithmeticCalculator::ClearAll(ON_ArithmeticCalculator *this)

{
  ON_ArithmeticCalculator *this_local;
  
  if (this->m_pCalc != (ON_ArithmeticCalculatorImplementation *)0x0) {
    ON_ArithmeticCalculatorImplementation::ClearStack(this->m_pCalc);
    ON_ArithmeticCalculatorImplementation::ClearStates(this->m_pCalc);
  }
  return;
}

Assistant:

void ON_ArithmeticCalculator::ClearAll()
{
  if ( m_pCalc )
  {
    // Do not clear configuration settings.
  
    // clear operation stack
    m_pCalc->ClearStack();
  
    // clear states
    m_pCalc->ClearStates();
  }
}